

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O3

int Bdc_SpfdHashValue(word t,int Size)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  uint3 uVar6;
  ulong uVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [15];
  word *pwVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  word t_local;
  
  pwVar10 = &t_local;
  t_local = t;
  lVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  uVar14 = 0;
  uVar15 = 0;
  do {
    auVar1 = *(undefined1 (*) [16])((long)If_CluHashKey::BigPrimes + lVar11);
    uVar2 = (undefined4)*pwVar10;
    uVar7 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar7;
    auVar3[0xc] = (char)((uint)uVar2 >> 0x18);
    auVar4[8] = (char)((uint)uVar2 >> 0x10);
    auVar4._0_8_ = uVar7;
    auVar4[9] = 0;
    auVar4._10_3_ = auVar3._10_3_;
    auVar8._5_8_ = 0;
    auVar8._0_5_ = auVar4._8_5_;
    auVar5[4] = (char)((uint)uVar2 >> 8);
    auVar5._0_4_ = (int)uVar7;
    auVar5[5] = 0;
    auVar5._6_7_ = SUB137(auVar8 << 0x40,6);
    uVar6 = auVar3._10_3_ >> 0x10;
    auVar9._12_3_ = uVar6;
    auVar9._0_12_ = ZEXT312(uVar6) << 0x40;
    uVar12 = uVar12 ^ auVar1._0_4_ * (int)uVar7;
    uVar13 = uVar13 ^ auVar5._4_4_ * auVar1._4_4_;
    uVar14 = uVar14 ^ (uint)((auVar1._8_8_ & 0xffffffff) * ((ulong)auVar4._8_5_ & 0xffffffff));
    uVar15 = uVar15 ^ (uint)(((ulong)auVar9._8_7_ & 0xffffffff) * (ulong)auVar1._12_4_);
    lVar11 = lVar11 + 0x10;
    pwVar10 = (word *)((long)pwVar10 + 4);
  } while (lVar11 != 0x20);
  return (uVar15 ^ uVar13 ^ uVar14 ^ uVar12) % (uint)Size;
}

Assistant:

int Bdc_SpfdHashValue( word t, int Size )
{
    // http://planetmath.org/encyclopedia/GoodHashTablePrimes.html
    // 53,
    // 97,
    // 193,
    // 389,
    // 769,
    // 1543,
    // 3079,
    // 6151,
    // 12289,
    // 24593,
    // 49157,
    // 98317,
    // 196613,
    // 393241,
    // 786433,
    // 1572869,
    // 3145739,
    // 6291469,
    // 12582917,
    // 25165843,
    // 50331653,
    // 100663319,
    // 201326611,
    // 402653189,
    // 805306457,
    // 1610612741,
    static unsigned BigPrimes[8] = {12582917, 25165843, 50331653, 100663319, 201326611, 402653189, 805306457, 1610612741};
    unsigned char * s = (unsigned char *)&t;
    unsigned i, Value = 0;
    for ( i = 0; i < 8; i++ )
        Value ^= BigPrimes[i] * s[i];
    return Value % Size;
}